

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  uint in_ESI;
  int *in_R9;
  char errmsg [81];
  char *in_stack_00000090;
  fitsfile *in_stack_00000098;
  char acStack_98 [96];
  int *local_38;
  int local_4;
  
  if (*in_R9 < 1) {
    local_38 = in_R9;
    if (in_ESI == 0x10) {
      ffpkys((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             (char *)CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_
            );
    }
    else if (in_ESI == 0xb) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0xc) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x14) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x15) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x1e) {
      ffpkyg((fitsfile *)errmsg._56_8_,(char *)errmsg._48_8_,(double)errmsg._40_8_,errmsg._36_4_,
             (char *)CONCAT44(errmsg._28_4_,errmsg._24_4_),(int *)errmsg._16_8_);
    }
    else if (in_ESI == 0x1f) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0xe) {
      ffpkyl((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),errmsg._28_4_,
             (char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x28) {
      ffpkyuj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
              CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x50) {
      ffpkyuj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
              CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x29) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x51) {
      ffpkyj((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             CONCAT44(errmsg._28_4_,errmsg._24_4_),(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x2a) {
      ffpkye((fitsfile *)errmsg._40_8_,(char *)CONCAT44(errmsg._36_4_,errmsg._32_4_),
             (float)errmsg._28_4_,errmsg._24_4_,(char *)errmsg._16_8_,(int *)errmsg._8_8_);
    }
    else if (in_ESI == 0x52) {
      ffpkyd((fitsfile *)errmsg._56_8_,(char *)errmsg._48_8_,(double)errmsg._40_8_,errmsg._36_4_,
             (char *)CONCAT44(errmsg._28_4_,errmsg._24_4_),(int *)errmsg._16_8_);
    }
    else if (in_ESI == 0x53) {
      ffpkyc(in_stack_00000098,in_stack_00000090,(float *)fptr,datatype,keyname,(int *)value);
    }
    else if (in_ESI == 0xa3) {
      ffpkym(in_stack_00000098,in_stack_00000090,(double *)fptr,datatype,keyname,(int *)value);
    }
    else {
      snprintf(acStack_98,0x51,"Bad keyword datatype code: %d (ffpky)",(ulong)in_ESI);
      ffpmsg((char *)0x235151);
      *local_38 = 0x19a;
    }
    local_4 = *local_38;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffpky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,/* I - name of keyword to write */
           void *value,        /* I - keyword value            */
           const char *comm,   /* I - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes a keyword value with the datatype specified by the 2nd argument.
*/
{
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffpkys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(unsigned char *) value, comm, status);
    }
    else if (datatype == TSBYTE)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(signed char *) value, comm, status);
    }
    else if (datatype == TUSHORT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(unsigned short *) value, comm, status);
    }
    else if (datatype == TSHORT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(short *) value, comm, status);
    }
    else if (datatype == TUINT)
    {
        ffpkyg(fptr, keyname, (double) *(unsigned int *) value, 0,
               comm, status);
    }
    else if (datatype == TINT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(int *) value, comm, status);
    }
    else if (datatype == TLOGICAL)
    {
        ffpkyl(fptr, keyname, *(int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        ffpkyuj(fptr, keyname, (ULONGLONG) *(unsigned long *) value,
               comm, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffpkyuj(fptr, keyname, (ULONGLONG) *(ULONGLONG *) value,
               comm, status);
    }
    else if (datatype == TLONG)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(long *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffpkyj(fptr, keyname, *(LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffpkye(fptr, keyname, *(float *) value, -7, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffpkyd(fptr, keyname, *(double *) value, -15, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffpkyc(fptr, keyname, (float *) value, -7, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffpkym(fptr, keyname, (double *) value, -15, comm, status);
    }
    else
    {
        snprintf(errmsg, FLEN_ERRMSG,"Bad keyword datatype code: %d (ffpky)", datatype);
        ffpmsg(errmsg);
        *status = BAD_DATATYPE;
    }

    return(*status);
}